

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::EnumValueOptions>
          (ParseContext *this,EnumValueOptions *msg,char *ptr)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  int iVar4;
  long in_RDX;
  long in_RDI;
  int old;
  int size;
  int in_stack_00000044;
  char *in_stack_00000048;
  EpsCopyInputStream *in_stack_00000050;
  char **in_stack_fffffffffffffff8;
  char *pcVar5;
  
  uVar2 = ReadSize(in_stack_fffffffffffffff8);
  if (in_RDX == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar3 = EpsCopyInputStream::PushLimit(in_stack_00000050,in_stack_00000048,in_stack_00000044);
    iVar4 = *(int *)(in_RDI + 0x58) + -1;
    *(int *)(in_RDI + 0x58) = iVar4;
    if (iVar4 < 0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = EnumValueOptions::_InternalParse(msg,ptr,_old);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
        bVar1 = EpsCopyInputStream::PopLimit
                          ((EpsCopyInputStream *)CONCAT44(uVar2,iVar3),(int)((ulong)in_RDI >> 0x20))
        ;
        if (!bVar1) {
          pcVar5 = (char *)0x0;
        }
      }
    }
  }
  return pcVar5;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}